

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O1

void uninitialize_all_placeholders(Am_Object *execute_command)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Assoc as;
  Am_Object ph;
  Am_Value_List ph_list;
  Am_Assoc local_58;
  Am_Object local_50;
  Am_Value_List local_48;
  Am_Value local_38;
  
  pAVar2 = Am_Object::Get(execute_command,Am_PLACEHOLDER_LIST,0);
  Am_Value_List::Am_Value_List(&local_48,pAVar2);
  local_58.data = (Am_Assoc_Data *)0x0;
  local_50.data = (Am_Object_Data *)0x0;
  Am_Value_List::Start(&local_48);
  while( true ) {
    bVar1 = Am_Value_List::Last(&local_48);
    if (bVar1) {
      Am_Object::~Am_Object(&local_50);
      Am_Assoc::~Am_Assoc(&local_58);
      Am_Value_List::~Am_Value_List(&local_48);
      return;
    }
    pAVar2 = Am_Value_List::Get(&local_48);
    Am_Assoc::operator=(&local_58,pAVar2);
    if (local_58.data == (Am_Assoc_Data *)0x0) break;
    Am_Value::Am_Value(&local_38,&(local_58.data)->value_2);
    Am_Object::operator=(&local_50,&local_38);
    Am_Value::~Am_Value(&local_38);
    Am_Object::Set(&local_50,Am_PLACEHOLDER_INITIALIZED,false,1);
    Am_Value_List::Next(&local_48);
  }
  Am_Error("Accessing (nullptr) Assoc");
}

Assistant:

void
uninitialize_all_placeholders(Am_Object &execute_command)
{
  Am_Value_List ph_list = execute_command.Get(Am_PLACEHOLDER_LIST);
  Am_Assoc as;
  Am_Object ph;
  for (ph_list.Start(); !ph_list.Last(); ph_list.Next()) {
    as = ph_list.Get();
    ph = as.Value_2();
    ph.Set(Am_PLACEHOLDER_INITIALIZED, false, Am_OK_IF_NOT_THERE);
  }
}